

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O2

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setBlend(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this,bool enable)

{
  uint uVar1;
  bool *pbVar2;
  GLuint i;
  ulong uVar3;
  
  if ((*this->Blend != enable) || (this->BlendInvalid == true)) {
    (*(&GL.Disable)[enable])(0xbe2);
    uVar1 = this->FrameBufferCount;
    pbVar2 = this->Blend;
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      pbVar2[uVar3] = enable;
    }
    this->BlendInvalid = false;
  }
  return;
}

Assistant:

void setBlend(bool enable)
	{
		if (Blend[0] != enable || BlendInvalid) {
			if (enable)
				GL.Enable(GL_BLEND);
			else
				GL.Disable(GL_BLEND);

			for (GLuint i = 0; i < FrameBufferCount; ++i)
				Blend[i] = enable;

			BlendInvalid = false;
		}
	}